

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O2

void __thiscall
Move::set_all(Move *this,string *word,int r,int c,bool across,int score,int blank_pos,int h)

{
  std::__cxx11::string::_M_assign((string *)this);
  this->length = (int)word->_M_string_length;
  this->row = r;
  this->col = c;
  this->across = across;
  this->score = score;
  this->blank_pos = blank_pos;
  this->heur_score = h;
  return;
}

Assistant:

void
    set_all(const std::string &word, int r, int c, bool across, int score, int blank_pos, int h = 0) {
        this->word = word;
        this->length = word.size();
        this->row = r;
        this->col = c;
        this->across = across;
        this->score = score;
        this->blank_pos = blank_pos;
        this->heur_score = h;
    }